

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O0

void __thiscall Assimp::LWO::Face::Face(Face *this,Face *f)

{
  Face *f_local;
  Face *this_local;
  
  aiFace::aiFace(&this->super_aiFace);
  operator=(this,f);
  return;
}

Assistant:

Face(const Face& f) : aiFace() {
        *this = f;
    }